

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SpanDeathTest_BoundsChecks_Test::TestBody
          (SpanDeathTest_BoundsChecks_Test *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  DeathTest *gtest_dt;
  DeathTest *local_108;
  AssertHelper local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("span[3]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6b,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    pDVar1 = local_108;
    bVar3 = true;
    if (bVar4) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00153082;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00153082:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00153095;
      }
      bVar3 = false;
    }
LAB_00153095:
    if (bVar3) goto LAB_00153099;
  }
  else {
LAB_00153099:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_60,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("span.subspan(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6c,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    pDVar1 = local_108;
    bVar3 = true;
    if (bVar4) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_001531e6;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_001531e6:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_001531f9;
      }
      bVar3 = false;
    }
LAB_001531f9:
    if (bVar3) goto LAB_001531fd;
  }
  else {
LAB_001531fd:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("span.first(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6d,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    pDVar1 = local_108;
    iVar5 = 6;
    if (bVar3) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_0015334a;
          iVar5 = 6;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_0015334a:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_0015335d;
      }
      iVar5 = 0;
    }
LAB_0015335d:
    if (iVar5 != 0) goto LAB_00153361;
  }
  else {
LAB_00153361:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_90,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("span.last(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6e,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    pDVar1 = local_108;
    bVar3 = true;
    if (bVar4) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_001534a5;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_001534a5:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_001534b8;
      }
      bVar3 = false;
    }
LAB_001534b8:
    if (bVar3) goto LAB_001534bc;
  }
  else {
LAB_001534bc:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("empty[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x71,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    pDVar1 = local_108;
    iVar5 = 10;
    if (bVar3) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00153600;
          iVar5 = 10;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00153600:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00153613;
      }
      iVar5 = 0;
    }
LAB_00153613:
    if (iVar5 != 0) goto LAB_00153617;
  }
  else {
LAB_00153617:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x71,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_100.data_ = (AssertHelperData *)0x34c229;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
               (testing *)&local_100,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c0,(PolymorphicMatcher *)&local_f8);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("empty.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x72,&local_108);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    pDVar1 = local_108;
    iVar5 = 0xc;
    if (bVar3) {
      if (local_108 != (DeathTest *)0x0) {
        iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar2 = local_108;
        if (iVar5 == 0) {
          iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_0015375b;
          iVar5 = 0xc;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) goto LAB_00153989;
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_0015375b:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_0015376e;
      }
      iVar5 = 0;
    }
LAB_0015376e:
    if (iVar5 != 0) goto LAB_00153772;
  }
  else {
LAB_00153772:
    testing::Message::Message((Message *)&local_f8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x72,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_001538cd;
  local_100.data_ = (AssertHelperData *)0x34c229;
  testing::ContainsRegex<char_const*>
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f8,
             (testing *)&local_100,regex_05);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_d8,(PolymorphicMatcher *)&local_f8);
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  bVar3 = testing::internal::DeathTest::Create
                    ("empty.back()",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&local_d8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                     ,0x73,&local_108);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_d8);
  pDVar1 = local_108;
  iVar5 = 0xe;
  if (bVar3) {
    if (local_108 != (DeathTest *)0x0) {
      iVar5 = (*local_108->_vptr_DeathTest[2])(local_108);
      pDVar2 = local_108;
      if (iVar5 == 0) {
        iVar5 = (*local_108->_vptr_DeathTest[3])(local_108);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        iVar5 = (*local_108->_vptr_DeathTest[4])(local_108,(ulong)bVar3);
        if ((char)iVar5 != '\0') goto LAB_001538b6;
        iVar5 = 0xe;
        bVar3 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
LAB_00153989:
            abort();
          }
          (*local_108->_vptr_DeathTest[5])(local_108,2);
          (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
        }
LAB_001538b6:
        iVar5 = 0;
        bVar3 = true;
      }
      (*pDVar1->_vptr_DeathTest[1])(pDVar1);
      if (!bVar3) goto LAB_001538c9;
    }
    iVar5 = 0;
  }
LAB_001538c9:
  if (iVar5 == 0) {
    return;
  }
LAB_001538cd:
  testing::Message::Message((Message *)&local_f8);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
             ,0x73,pcVar6);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  if (local_f8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_f8._M_head_impl + 8))();
  }
  return;
}

Assistant:

TEST(SpanDeathTest, BoundsChecks) {
  // Make an array that's larger than we need, so that a failure to bounds check
  // won't crash.
  const int v[] = {1, 2, 3, 4};
  Span<const int> span(v, 3);
  // Out of bounds access.
  EXPECT_DEATH_IF_SUPPORTED(span[3], "");
  EXPECT_DEATH_IF_SUPPORTED(span.subspan(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.first(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.last(4), "");
  // Accessing an empty span.
  Span<const int> empty(v, 0);
  EXPECT_DEATH_IF_SUPPORTED(empty[0], "");
  EXPECT_DEATH_IF_SUPPORTED(empty.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(empty.back(), "");
}